

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model_test.cc
# Opt level: O0

void __thiscall
gtest_suite_FlatBlockEstimatorTest_::FindFlatBlocks<BitDepthParams<unsigned_char,_8,_false>_>::
TestBody(FindFlatBlocks<BitDepthParams<unsigned_char,_8,_false>_> *this)

{
  value_type vVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  char *pcVar5;
  AssertHelper *this_00;
  byte bVar6;
  long in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_01;
  double dVar7;
  double dVar8;
  AssertionResult gtest_ar_18;
  AssertionResult gtest_ar_17;
  AssertionResult gtest_ar_16;
  AssertionResult gtest_ar_15;
  AssertionResult gtest_ar_14;
  AssertionResult gtest_ar_13;
  AssertionResult gtest_ar_12;
  AssertionResult gtest_ar_11;
  AssertionResult gtest_ar_10;
  int x_1;
  int y_1;
  AssertionResult gtest_ar_9;
  AssertionResult gtest_ar_8;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  int big_check;
  int strong_edge;
  int check;
  int x;
  int y;
  int shift;
  vector<unsigned_char,_std::allocator<unsigned_char>_> flat_blocks;
  int stride;
  int w;
  int h;
  int num_blocks_w;
  AssertionResult gtest_ar;
  aom_flat_block_finder_t flat_block_finder;
  int kBlockSize;
  AssertHelper *in_stack_fffffffffffffb30;
  allocator_type *in_stack_fffffffffffffb38;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb48;
  int iVar9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb50;
  size_type in_stack_fffffffffffffb58;
  Type type;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb60;
  undefined8 in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  aom_flat_block_finder_t *in_stack_fffffffffffffba8;
  AssertHelper *in_stack_fffffffffffffbb0;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_fffffffffffffc88;
  int in_stack_fffffffffffffc94;
  int in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  undefined4 in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffca4;
  aom_flat_block_finder_t *in_stack_fffffffffffffca8;
  AssertionResult local_330 [2];
  undefined4 local_30c;
  AssertionResult local_308 [2];
  undefined4 local_2e4;
  AssertionResult local_2e0 [2];
  undefined4 local_2bc;
  AssertionResult local_2b8 [2];
  undefined4 local_294;
  AssertionResult local_290 [2];
  undefined4 local_26c;
  AssertionResult local_268 [2];
  int local_248;
  undefined4 local_244;
  AssertionResult local_240;
  int local_230;
  int local_22c;
  undefined4 local_214;
  AssertionResult local_210 [2];
  undefined4 local_1ec;
  AssertionResult local_1e8 [2];
  undefined4 local_1c4;
  AssertionResult local_1c0 [2];
  undefined4 local_19c;
  AssertionResult local_198 [2];
  undefined4 local_174;
  AssertionResult local_170 [2];
  undefined4 local_14c;
  AssertionResult local_148 [2];
  undefined4 local_124;
  AssertionResult local_120 [2];
  undefined4 local_fc;
  AssertionResult local_f8 [2];
  int local_d8;
  undefined4 local_d4;
  AssertionResult local_d0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  undefined4 local_a8;
  undefined1 local_a1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  undefined1 local_85;
  undefined4 local_84;
  undefined4 local_80;
  undefined4 local_7c;
  undefined4 local_78;
  uint local_74;
  int local_50;
  undefined4 local_4c;
  AssertionResult local_48 [3];
  undefined4 local_c;
  
  local_c = 0x20;
  local_4c = 1;
  local_50 = aom_flat_block_finder_init
                       (in_stack_fffffffffffffba8,(int)((ulong)in_stack_fffffffffffffba0 >> 0x20),
                        (int)in_stack_fffffffffffffba0,
                        (int)((ulong)in_stack_fffffffffffffb98 >> 0x20));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
             (int *)in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30);
  bVar2 = testing::AssertionResult::operator_cast_to_bool(local_48);
  if (!bVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffb60);
    testing::AssertionResult::failure_message((AssertionResult *)0x5b49a4);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20),
               (char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
               (char *)in_stack_fffffffffffffb40);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
    testing::Message::~Message((Message *)0x5b4a07);
  }
  local_74 = (uint)!bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b4a8e);
  if (local_74 == 0) {
    local_78 = 8;
    local_7c = 0x20;
    local_80 = 0x100;
    local_84 = 0x100;
    local_85 = 0x80;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (in_stack_fffffffffffffb60,in_stack_fffffffffffffb58,
               (value_type_conflict2 *)in_stack_fffffffffffffb50);
    local_a1 = 0;
    std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x5b4b0f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48,
               (value_type_conflict2 *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
    std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x5b4b40);
    local_a8 = 0;
    for (local_ac = 0; local_ac < 0x20; local_ac = local_ac + 1) {
      for (local_b0 = 0; local_b0 < 0x20; local_b0 = local_b0 + 1) {
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_ac * 0x100 + local_b0));
        *pvVar4 = (value_type)(0x80 << bVar6);
        dVar7 = anon_unknown.dwarf_4f15e6::randn
                          ((ACMRandom *)in_stack_fffffffffffffb50,(double)in_stack_fffffffffffffb48)
        ;
        bVar6 = (byte)local_a8 & 0x1f;
        this_01 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10);
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this_01,(long)(local_ac * 0x100 + 0x20 + local_b0));
        *pvVar4 = (value_type)((int)(dVar7 + 128.0) << bVar6);
        uVar3 = local_b0 % 2 + local_ac % 2;
        iVar9 = (uint)(uVar3 == (uVar3 - ((int)uVar3 >> 0x1f) & 0xfffffffe)) * 4;
        local_b4 = iVar9 + -2;
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this_01,(long)(local_ac * 0x100 + 0x40 + local_b0));
        *pvVar4 = (value_type)(iVar9 + 0x7e << bVar6);
        iVar9 = (local_ac * 2 - ((uint)(local_b0 - (local_b0 >> 0x1f)) >> 1)) + 0x80 + local_b4;
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (this_01,(long)(local_ac * 0x100 + 0x60 + local_b0));
        *pvVar4 = (value_type)(iVar9 << bVar6);
        dVar7 = anon_unknown.dwarf_4f15e6::randn
                          ((ACMRandom *)in_stack_fffffffffffffb50,(double)in_stack_fffffffffffffb48)
        ;
        dVar8 = (double)local_b0;
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_ac * 0x100 + 0x80 + local_b0));
        *pvVar4 = (value_type)((int)(dVar7 + dVar8 + 128.0) << bVar6);
        dVar7 = anon_unknown.dwarf_4f15e6::randn
                          ((ACMRandom *)in_stack_fffffffffffffb50,(double)in_stack_fffffffffffffb48)
        ;
        dVar8 = (double)local_ac;
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_ac * 0x100 + 0xa0 + local_b0));
        *pvVar4 = (value_type)((int)(dVar7 + dVar8 + 128.0) << bVar6);
        local_b8 = (uint)(0x10 < local_b0) << 6;
        dVar7 = anon_unknown.dwarf_4f15e6::randn
                          ((ACMRandom *)in_stack_fffffffffffffb50,(double)in_stack_fffffffffffffb48)
        ;
        dVar8 = (double)local_b8;
        bVar6 = (byte)local_a8 & 0x1f;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_ac * 0x100 + 0xc0 + local_b0));
        *pvVar4 = (value_type)((int)(dVar7 + dVar8 + 128.0) << bVar6);
        uVar3 = ((local_b0 >> 2) - ((local_b0 >> 2) - (local_b0 >> 0x1f) & 0xfffffffeU)) +
                ((local_ac >> 2) - ((local_ac >> 2) - (local_ac >> 0x1f) & 0xfffffffeU));
        local_bc = (uint)(uVar3 == (uVar3 - ((int)uVar3 >> 0x1f) & 0xfffffffe)) * 0x20 + -0x10;
        dVar7 = anon_unknown.dwarf_4f15e6::randn
                          ((ACMRandom *)in_stack_fffffffffffffb50,(double)in_stack_fffffffffffffb48)
        ;
        dVar8 = (double)local_bc;
        bVar6 = (byte)local_a8;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_ac * 0x100 + local_b0 + 0xe0));
        *pvVar4 = (value_type)(((int)(dVar7 + dVar8 + 128.0) & 0xffU) << (bVar6 & 0x1f));
      }
    }
    local_d4 = 4;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10),0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,0);
    local_d8 = aom_flat_block_finder_run
                         (in_stack_fffffffffffffca8,
                          (uint8_t *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                          in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                          in_stack_fffffffffffffc94,
                          (uint8_t *)in_stack_fffffffffffffc88._M_head_impl);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_d0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b5164);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b51c7);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5235);
    local_fc = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,0);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_f8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b52bf);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5322);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5390);
    local_124 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,1);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_120);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b541b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b547e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b54ec);
    local_14c = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,2);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_148);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b5577);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b55da);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5648);
    local_174 = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,3);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_170);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b56d3);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5736);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b57a4);
    local_19c = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,4);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_198);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffbb0 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x5b582f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5892);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5900);
    local_1c4 = 0xff;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,5);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1c0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffba8 =
           (aom_flat_block_finder_t *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5b598b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b59ee);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5a5c);
    local_1ec = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,6);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_1e8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b5ae7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5b44);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5bb2);
    local_214 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,7);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_210);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b5c3d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,(Type)(in_stack_fffffffffffffb58 >> 0x20)
                 ,(char *)in_stack_fffffffffffffb50,(int)((ulong)in_stack_fffffffffffffb48 >> 0x20),
                 (char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5c9a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5d0b);
    for (local_22c = 0; type = (Type)(in_stack_fffffffffffffb58 >> 0x20), local_22c < 0x20;
        local_22c = local_22c + 1) {
      for (local_230 = 0; local_230 < 0x100; local_230 = local_230 + 1) {
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_22c * 0x100 + local_230 % 0x20 + 0x20));
        vVar1 = *pvVar4;
        bVar6 = (byte)local_a8;
        pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10)
                            ,(long)(local_22c * 0x100 + local_230));
        *pvVar4 = *pvVar4 + (vVar1 - (char)(0x80 << (bVar6 & 0x1f)));
      }
    }
    local_244 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x10),0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,0);
    local_248 = aom_flat_block_finder_run
                          (in_stack_fffffffffffffca8,
                           (uint8_t *)CONCAT44(in_stack_fffffffffffffca4,in_stack_fffffffffffffca0),
                           in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98,
                           in_stack_fffffffffffffc94,
                           (uint8_t *)in_stack_fffffffffffffc88._M_head_impl);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(int *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(&local_240);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b5ed4);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b5f31);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b5f9f);
    local_26c = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,0);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_268);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      testing::AssertionResult::failure_message((AssertionResult *)0x5b6029);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b6086);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b60f4);
    local_294 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,1);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_290);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb60 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5b617f);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b61dc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b624a);
    local_2bc = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,2);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2b8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x5b62d5);
      type = (Type)((ulong)pcVar5 >> 0x20);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b6332);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b63a0);
    local_2e4 = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,3);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_2e0);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb50 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5b642b);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b6488);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b64f6);
    local_30c = 0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,4);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_308);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb48 =
           testing::AssertionResult::failure_message((AssertionResult *)0x5b6581);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b65de);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b664c);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,5);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool(local_330);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb40 =
           (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           testing::AssertionResult::failure_message((AssertionResult *)0x5b66d7);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b6734);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b67a2);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,6);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffca8);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      in_stack_fffffffffffffb38 =
           (allocator_type *)testing::AssertionResult::failure_message((AssertionResult *)0x5b682d);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 (int)((ulong)in_stack_fffffffffffffb48 >> 0x20),(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffffb30);
      testing::Message::~Message((Message *)0x5b688a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b68f8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&local_a0,7);
    testing::internal::EqHelper::Compare<int,_unsigned_char,_nullptr>
              (in_stack_fffffffffffffb48,(char *)in_stack_fffffffffffffb40,
               (int *)in_stack_fffffffffffffb38,(uchar *)in_stack_fffffffffffffb30);
    iVar9 = (int)((ulong)in_stack_fffffffffffffb48 >> 0x20);
    bVar2 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xfffffffffffffc80);
    if (!bVar2) {
      testing::Message::Message((Message *)in_stack_fffffffffffffb60);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x5b6983);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)in_stack_fffffffffffffb60,type,(char *)in_stack_fffffffffffffb50,
                 iVar9,(char *)in_stack_fffffffffffffb40);
      testing::internal::AssertHelper::operator=
                (in_stack_fffffffffffffbb0,(Message *)in_stack_fffffffffffffba8);
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x5b69e0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x5b6a4b);
    aom_flat_block_finder_free((aom_flat_block_finder_t *)0x5b6a58);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(in_stack_fffffffffffffb40);
  }
  return;
}

Assistant:

TYPED_TEST_P(FlatBlockEstimatorTest, FindFlatBlocks) {
  const int kBlockSize = 32;
  aom_flat_block_finder_t flat_block_finder;
  ASSERT_EQ(1, aom_flat_block_finder_init(&flat_block_finder, kBlockSize,
                                          this->kBitDepth, this->kUseHighBD));

  const int num_blocks_w = 8;
  const int h = kBlockSize;
  const int w = kBlockSize * num_blocks_w;
  const int stride = w;
  this->data_.resize(h * stride, 128);
  std::vector<uint8_t> flat_blocks(num_blocks_w, 0);

  const int shift = this->kBitDepth - 8;
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize; ++x) {
      // Block 0 (not flat): constant doesn't have enough variance to qualify
      this->data_[y * stride + x + 0 * kBlockSize] = 128 << shift;

      // Block 1 (not flat): too high of variance is hard to validate as flat
      this->data_[y * stride + x + 1 * kBlockSize] =
          ((uint8_t)(128 + randn(&this->random_, 5))) << shift;

      // Block 2 (flat): slight checkerboard added to constant
      const int check = (x % 2 + y % 2) % 2 ? -2 : 2;
      this->data_[y * stride + x + 2 * kBlockSize] = (128 + check) << shift;

      // Block 3 (flat): planar block with checkerboard pattern is also flat
      this->data_[y * stride + x + 3 * kBlockSize] =
          (y * 2 - x / 2 + 128 + check) << shift;

      // Block 4 (flat): gaussian random with standard deviation 1.
      this->data_[y * stride + x + 4 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + x + 128.0)) << shift;

      // Block 5 (flat): gaussian random with standard deviation 2.
      this->data_[y * stride + x + 5 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 2) + y + 128.0)) << shift;

      // Block 6 (not flat): too high of directional gradient.
      const int strong_edge = x > kBlockSize / 2 ? 64 : 0;
      this->data_[y * stride + x + 6 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + strong_edge + 128.0)) << shift;

      // Block 7 (not flat): too high gradient.
      const int big_check = ((x >> 2) % 2 + (y >> 2) % 2) % 2 ? -16 : 16;
      this->data_[y * stride + x + 7 * kBlockSize] =
          ((uint8_t)(randn(&this->random_, 1) + big_check + 128.0)) << shift;
    }
  }

  EXPECT_EQ(4, aom_flat_block_finder_run(&flat_block_finder,
                                         (uint8_t *)&this->data_[0], w, h,
                                         stride, &flat_blocks[0]));

  // First two blocks are not flat
  EXPECT_EQ(0, flat_blocks[0]);
  EXPECT_EQ(0, flat_blocks[1]);

  // Next 4 blocks are flat.
  EXPECT_EQ(255, flat_blocks[2]);
  EXPECT_EQ(255, flat_blocks[3]);
  EXPECT_EQ(255, flat_blocks[4]);
  EXPECT_EQ(255, flat_blocks[5]);

  // Last 2 are not flat by threshold
  EXPECT_EQ(0, flat_blocks[6]);
  EXPECT_EQ(0, flat_blocks[7]);

  // Add the noise from non-flat block 1 to every block.
  for (int y = 0; y < kBlockSize; ++y) {
    for (int x = 0; x < kBlockSize * num_blocks_w; ++x) {
      this->data_[y * stride + x] +=
          (this->data_[y * stride + x % kBlockSize + kBlockSize] -
           (128 << shift));
    }
  }
  // Now the scored selection will pick the one that is most likely flat (block
  // 0)
  EXPECT_EQ(1, aom_flat_block_finder_run(&flat_block_finder,
                                         (uint8_t *)&this->data_[0], w, h,
                                         stride, &flat_blocks[0]));
  EXPECT_EQ(1, flat_blocks[0]);
  EXPECT_EQ(0, flat_blocks[1]);
  EXPECT_EQ(0, flat_blocks[2]);
  EXPECT_EQ(0, flat_blocks[3]);
  EXPECT_EQ(0, flat_blocks[4]);
  EXPECT_EQ(0, flat_blocks[5]);
  EXPECT_EQ(0, flat_blocks[6]);
  EXPECT_EQ(0, flat_blocks[7]);

  aom_flat_block_finder_free(&flat_block_finder);
}